

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

int X509V3_EXT_add_nconf_sk(CONF *conf,X509V3_CTX *ctx,char *section,stack_st_X509_EXTENSION **sk)

{
  stack_st_CONF_VALUE *sk_00;
  CONF_VALUE *pCVar1;
  X509_EXTENSION *ex;
  stack_st_X509_EXTENSION *psVar2;
  bool bVar3;
  int ok;
  X509_EXTENSION *ext;
  CONF_VALUE *val;
  size_t i;
  stack_st_CONF_VALUE *nval;
  stack_st_X509_EXTENSION **sk_local;
  char *section_local;
  X509V3_CTX *ctx_local;
  CONF *conf_local;
  
  sk_00 = (stack_st_CONF_VALUE *)NCONF_get_section(conf,section);
  if (sk_00 == (stack_st_CONF_VALUE *)0x0) {
    conf_local._4_4_ = 0;
  }
  else {
    for (val = (CONF_VALUE *)0x0; pCVar1 = (CONF_VALUE *)sk_CONF_VALUE_num(sk_00), val < pCVar1;
        val = (CONF_VALUE *)((long)&val->section + 1)) {
      pCVar1 = sk_CONF_VALUE_value(sk_00,(size_t)val);
      ex = X509V3_EXT_nconf(conf,ctx,pCVar1->name,pCVar1->value);
      bVar3 = false;
      if ((ex != (X509_EXTENSION *)0x0) && (bVar3 = true, sk != (stack_st_X509_EXTENSION **)0x0)) {
        psVar2 = X509v3_add_ext(sk,ex,-1);
        bVar3 = psVar2 != (stack_st_X509_EXTENSION *)0x0;
      }
      X509_EXTENSION_free(ex);
      if (!bVar3) {
        return 0;
      }
    }
    conf_local._4_4_ = 1;
  }
  return conf_local._4_4_;
}

Assistant:

int X509V3_EXT_add_nconf_sk(const CONF *conf, const X509V3_CTX *ctx,
                            const char *section,
                            STACK_OF(X509_EXTENSION) **sk) {
  const STACK_OF(CONF_VALUE) *nval = NCONF_get_section(conf, section);
  if (nval == NULL) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    X509_EXTENSION *ext = X509V3_EXT_nconf(conf, ctx, val->name, val->value);
    int ok = ext != NULL &&  //
             (sk == NULL || X509v3_add_ext(sk, ext, -1) != NULL);
    X509_EXTENSION_free(ext);
    if (!ok) {
      return 0;
    }
  }
  return 1;
}